

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  CallBasicTests();
  CallMultithreadTests();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	(void)argc;
	(void)argv;

	CallBasicTests();
	CallMultithreadTests();
	//std::cin.get();

	return 0;
}